

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall cmFileCopier::CheckKeyword(cmFileCopier *this,string *arg)

{
  bool bVar1;
  string *arg_local;
  cmFileCopier *this_local;
  
  bVar1 = std::operator==(arg,"DESTINATION");
  if (bVar1) {
    if (this->CurrentMatchRule == (MatchRule *)0x0) {
      this->Doing = 2;
    }
    else {
      NotAfterMatch(this,arg);
    }
  }
  else {
    bVar1 = std::operator==(arg,"PATTERN");
    if (bVar1) {
      this->Doing = 4;
    }
    else {
      bVar1 = std::operator==(arg,"REGEX");
      if (bVar1) {
        this->Doing = 5;
      }
      else {
        bVar1 = std::operator==(arg,"EXCLUDE");
        if (bVar1) {
          if (this->CurrentMatchRule == (MatchRule *)0x0) {
            NotBeforeMatch(this,arg);
          }
          else {
            (this->CurrentMatchRule->Properties).Exclude = true;
            this->Doing = 0;
          }
        }
        else {
          bVar1 = std::operator==(arg,"PERMISSIONS");
          if (bVar1) {
            if (this->CurrentMatchRule == (MatchRule *)0x0) {
              NotBeforeMatch(this,arg);
            }
            else {
              this->Doing = 8;
            }
          }
          else {
            bVar1 = std::operator==(arg,"FILE_PERMISSIONS");
            if (bVar1) {
              if (this->CurrentMatchRule == (MatchRule *)0x0) {
                this->Doing = 6;
                this->UseGivenPermissionsFile = true;
              }
              else {
                NotAfterMatch(this,arg);
              }
            }
            else {
              bVar1 = std::operator==(arg,"DIRECTORY_PERMISSIONS");
              if (bVar1) {
                if (this->CurrentMatchRule == (MatchRule *)0x0) {
                  this->Doing = 7;
                  this->UseGivenPermissionsDir = true;
                }
                else {
                  NotAfterMatch(this,arg);
                }
              }
              else {
                bVar1 = std::operator==(arg,"USE_SOURCE_PERMISSIONS");
                if (bVar1) {
                  if (this->CurrentMatchRule == (MatchRule *)0x0) {
                    this->Doing = 0;
                    this->UseSourcePermissions = true;
                  }
                  else {
                    NotAfterMatch(this,arg);
                  }
                }
                else {
                  bVar1 = std::operator==(arg,"NO_SOURCE_PERMISSIONS");
                  if (bVar1) {
                    if (this->CurrentMatchRule == (MatchRule *)0x0) {
                      this->Doing = 0;
                      this->UseSourcePermissions = false;
                    }
                    else {
                      NotAfterMatch(this,arg);
                    }
                  }
                  else {
                    bVar1 = std::operator==(arg,"FILES_MATCHING");
                    if (!bVar1) {
                      return false;
                    }
                    if (this->CurrentMatchRule == (MatchRule *)0x0) {
                      this->Doing = 0;
                      this->MatchlessFiles = false;
                    }
                    else {
                      NotAfterMatch(this,arg);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool cmFileCopier::CheckKeyword(std::string const& arg)
{
  if(arg == "DESTINATION")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingDestination;
      }
    }
  else if(arg == "PATTERN")
    {
    this->Doing = DoingPattern;
    }
  else if(arg == "REGEX")
    {
    this->Doing = DoingRegex;
    }
  else if(arg == "EXCLUDE")
    {
    // Add this property to the current match rule.
    if(this->CurrentMatchRule)
      {
      this->CurrentMatchRule->Properties.Exclude = true;
      this->Doing = DoingNone;
      }
    else
      {
      this->NotBeforeMatch(arg);
      }
    }
  else if(arg == "PERMISSIONS")
    {
    if(this->CurrentMatchRule)
      {
      this->Doing = DoingPermissionsMatch;
      }
    else
      {
      this->NotBeforeMatch(arg);
      }
    }
  else if(arg == "FILE_PERMISSIONS")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingPermissionsFile;
      this->UseGivenPermissionsFile = true;
      }
    }
  else if(arg == "DIRECTORY_PERMISSIONS")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingPermissionsDir;
      this->UseGivenPermissionsDir = true;
      }
    }
  else if(arg == "USE_SOURCE_PERMISSIONS")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingNone;
      this->UseSourcePermissions = true;
      }
    }
  else if(arg == "NO_SOURCE_PERMISSIONS")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingNone;
      this->UseSourcePermissions = false;
      }
    }
  else if(arg == "FILES_MATCHING")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingNone;
      this->MatchlessFiles = false;
      }
    }
  else
    {
    return false;
    }
  return true;
}